

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfDeepTiledInputFile.cpp
# Opt level: O3

void __thiscall Imf_2_5::anon_unknown_8::TileBufferTask::execute(TileBufferTask *this)

{
  TileBuffer *pTVar1;
  TOutSliceInfo *pTVar2;
  long *plVar3;
  bool bVar4;
  int iVar5;
  uint uVar6;
  char *pcVar7;
  Data *pDVar8;
  Compression *pCVar9;
  Compressor *pCVar10;
  pointer ppTVar11;
  long lVar12;
  pointer ppTVar13;
  int iVar14;
  int iVar15;
  ulong uVar16;
  long lVar17;
  pointer pcVar18;
  TileBuffer *pTVar19;
  ulong uVar20;
  int yOffsetForData;
  pointer pcVar21;
  TileBufferTask *pTVar22;
  ulong uVar23;
  long lVar24;
  char *pcVar25;
  Box2i tileRange;
  int local_d0;
  char *writePtr_1;
  int local_bc;
  TileBufferTask *local_b8;
  char *writePtr;
  vector<unsigned_long,_std::allocator<unsigned_long>_> bytesPerLine;
  vector<int,_std::allocator<int>_> yOffsets;
  vector<int,_std::allocator<int>_> xOffsets;
  char *compPtr;
  char *readPtr;
  int local_48;
  int iStack_44;
  int iStack_40;
  int iStack_3c;
  
  pDVar8 = this->_ofd;
  pTVar1 = this->_tileBuffer;
  Imf_2_5::dataWindowForTile
            ((Imf_2_5 *)&tileRange,&pDVar8->tileDesc,pDVar8->minX,pDVar8->maxX,pDVar8->minY,
             pDVar8->maxY,*(int *)&(pTVar1->_sem)._vptr_Semaphore,
             *(int *)((long)&(pTVar1->_sem)._vptr_Semaphore + 4),*(int *)&(pTVar1->_sem)._semaphore,
             *(int *)((long)&(pTVar1->_sem)._semaphore + 4));
  local_bc = tileRange.max.y - tileRange.min.y;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (&bytesPerLine,(ulong)(this->_ofd->tileDesc).ySize,(allocator_type *)&xOffsets);
  std::vector<int,_std::allocator<int>_>::vector
            (&xOffsets,
             (long)(this->_ofd->slices).
                   super__Vector_base<Imf_2_5::(anonymous_namespace)::TOutSliceInfo_*,_std::allocator<Imf_2_5::(anonymous_namespace)::TOutSliceInfo_*>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)(this->_ofd->slices).
                   super__Vector_base<Imf_2_5::(anonymous_namespace)::TOutSliceInfo_*,_std::allocator<Imf_2_5::(anonymous_namespace)::TOutSliceInfo_*>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 3,(allocator_type *)&yOffsets);
  std::vector<int,_std::allocator<int>_>::vector
            (&yOffsets,
             (long)(this->_ofd->slices).
                   super__Vector_base<Imf_2_5::(anonymous_namespace)::TOutSliceInfo_*,_std::allocator<Imf_2_5::(anonymous_namespace)::TOutSliceInfo_*>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)(this->_ofd->slices).
                   super__Vector_base<Imf_2_5::(anonymous_namespace)::TOutSliceInfo_*,_std::allocator<Imf_2_5::(anonymous_namespace)::TOutSliceInfo_*>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 3,(allocator_type *)&writePtr_1);
  pDVar8 = this->_ofd;
  ppTVar11 = (pDVar8->slices).
             super__Vector_base<Imf_2_5::(anonymous_namespace)::TOutSliceInfo_*,_std::allocator<Imf_2_5::(anonymous_namespace)::TOutSliceInfo_*>_>
             ._M_impl.super__Vector_impl_data._M_start;
  lVar12 = (long)(pDVar8->slices).
                 super__Vector_base<Imf_2_5::(anonymous_namespace)::TOutSliceInfo_*,_std::allocator<Imf_2_5::(anonymous_namespace)::TOutSliceInfo_*>_>
                 ._M_impl.super__Vector_impl_data._M_finish - (long)ppTVar11;
  if (lVar12 != 0) {
    lVar12 = lVar12 >> 3;
    lVar17 = 0;
    do {
      pTVar2 = ppTVar11[lVar17];
      xOffsets.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start[lVar17] = tileRange.min.x * pTVar2->xTileCoords;
      yOffsets.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start[lVar17] = tileRange.min.y * pTVar2->yTileCoords;
      lVar17 = lVar17 + 1;
    } while (lVar12 + (ulong)(lVar12 == 0) != lVar17);
  }
  calculateBytesPerLine
            (&pDVar8->header,pDVar8->sampleCountSliceBase,pDVar8->sampleCountXStride,
             pDVar8->sampleCountYStride,tileRange.min.x,tileRange.max.x,tileRange.min.y,
             tileRange.max.y,&xOffsets,&yOffsets,&bytesPerLine);
  if ((long)bytesPerLine.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_finish -
      (long)bytesPerLine.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_start == 0) {
    uVar23 = 0;
    pcVar25 = (char *)0x0;
  }
  else {
    lVar12 = (long)bytesPerLine.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                   _M_impl.super__Vector_impl_data._M_finish -
             (long)bytesPerLine.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                   _M_impl.super__Vector_impl_data._M_start >> 3;
    pcVar25 = (char *)0x0;
    uVar23 = 0;
    lVar17 = 0;
    do {
      uVar20 = bytesPerLine.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
               _M_impl.super__Vector_impl_data._M_start[lVar17];
      pcVar25 = pcVar25 + uVar20;
      if (uVar23 < uVar20) {
        uVar23 = uVar20;
      }
      lVar17 = lVar17 + 1;
    } while (lVar12 + (ulong)(lVar12 == 0) != lVar17);
  }
  pTVar1 = this->_tileBuffer;
  pcVar7 = (char *)operator_new__((ulong)pcVar25);
  pTVar19 = pTVar1;
  if (pTVar1->buffer != (char *)0x0) {
    operator_delete__(pTVar1->buffer);
    pTVar19 = this->_tileBuffer;
  }
  pTVar1->uncompressedData = pcVar25;
  pTVar1->buffer = pcVar7;
  writePtr = pTVar19->buffer;
  pDVar8 = this->_ofd;
  local_d0 = pDVar8->sampleCountXTileCoords;
  if (local_d0 != 0) {
    local_d0 = tileRange.min.x;
  }
  iVar5 = pDVar8->sampleCountYTileCoords;
  if (pDVar8->sampleCountYTileCoords != 0) {
    iVar5 = tileRange.min.y;
  }
  local_b8 = this;
  iVar15 = tileRange.max.y;
  if (tileRange.min.y <= tileRange.max.y) {
    iVar14 = tileRange.min.y;
    do {
      ppTVar11 = (pDVar8->slices).
                 super__Vector_base<Imf_2_5::(anonymous_namespace)::TOutSliceInfo_*,_std::allocator<Imf_2_5::(anonymous_namespace)::TOutSliceInfo_*>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      if ((pDVar8->slices).
          super__Vector_base<Imf_2_5::(anonymous_namespace)::TOutSliceInfo_*,_std::allocator<Imf_2_5::(anonymous_namespace)::TOutSliceInfo_*>_>
          ._M_impl.super__Vector_impl_data._M_finish != ppTVar11) {
        uVar20 = 0;
        pTVar22 = this;
        uVar16 = 1;
        do {
          this = local_b8;
          pTVar2 = ppTVar11[uVar20];
          if (pTVar2->zero == true) {
            fillChannelWithZeroes
                      (&writePtr,pDVar8->format,pTVar2->type,
                       bytesPerLine.
                       super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                       super__Vector_impl_data._M_start[(long)iVar14 - (long)tileRange.min.y]);
            this = pTVar22;
          }
          else {
            iVar15 = pTVar2->xTileCoords;
            if (pTVar2->xTileCoords != 0) {
              iVar15 = tileRange.min.x;
            }
            yOffsetForData = pTVar2->yTileCoords;
            if (pTVar2->yTileCoords != 0) {
              yOffsetForData = tileRange.min.y;
            }
            copyFromDeepFrameBuffer
                      (&writePtr,pTVar2->base,pDVar8->sampleCountSliceBase,
                       (long)pDVar8->sampleCountXStride,(long)pDVar8->sampleCountYStride,iVar14,
                       tileRange.min.x,tileRange.max.x,local_d0,iVar5,iVar15,yOffsetForData,
                       pTVar2->sampleStride,pTVar2->xStride,pTVar2->yStride,pDVar8->format,
                       pTVar2->type);
          }
          pDVar8 = this->_ofd;
          ppTVar11 = (pDVar8->slices).
                     super__Vector_base<Imf_2_5::(anonymous_namespace)::TOutSliceInfo_*,_std::allocator<Imf_2_5::(anonymous_namespace)::TOutSliceInfo_*>_>
                     ._M_impl.super__Vector_impl_data._M_start;
          bVar4 = uVar16 < (ulong)((long)(pDVar8->slices).
                                         super__Vector_base<Imf_2_5::(anonymous_namespace)::TOutSliceInfo_*,_std::allocator<Imf_2_5::(anonymous_namespace)::TOutSliceInfo_*>_>
                                         ._M_impl.super__Vector_impl_data._M_finish - (long)ppTVar11
                                  >> 3);
          uVar20 = uVar16;
          pTVar22 = this;
          uVar16 = (ulong)((int)uVar16 + 1);
          iVar15 = tileRange.max.y;
        } while (bVar4);
      }
      bVar4 = iVar14 < iVar15;
      iVar14 = iVar14 + 1;
    } while (bVar4);
    pTVar19 = this->_tileBuffer;
  }
  iVar14 = 0;
  if (tileRange.min.y <= iVar15) {
    pcVar21 = (pTVar19->exception)._M_dataplus._M_p;
    iVar14 = 0;
    uVar20 = (ulong)(uint)tileRange.max.x;
    lVar12 = (long)tileRange.min.y;
    do {
      if (tileRange.min.x <= (int)uVar20) {
        iVar15 = 0;
        lVar17 = (long)tileRange.min.x;
        do {
          pcVar18 = pcVar21;
          pDVar8 = this->_ofd;
          iVar15 = iVar15 + *(int *)(pDVar8->sampleCountSliceBase +
                                    (long)pDVar8->sampleCountXStride * (lVar17 - local_d0) +
                                    (long)pDVar8->sampleCountYStride * (lVar12 - iVar5));
          writePtr_1 = (char *)CONCAT44(writePtr_1._4_4_,iVar15);
          lVar24 = 0;
          do {
            pcVar18[lVar24] = *(char *)((long)&writePtr_1 + lVar24);
            lVar24 = lVar24 + 1;
          } while ((int)lVar24 != 4);
          iVar14 = iVar14 + 4;
          uVar20 = (ulong)tileRange.max.x;
          bVar4 = lVar17 < (long)uVar20;
          pcVar21 = pcVar18 + lVar24;
          lVar17 = lVar17 + 1;
        } while (bVar4);
        pcVar21 = pcVar18 + lVar24;
        iVar15 = tileRange.max.y;
      }
      bVar4 = lVar12 < iVar15;
      lVar12 = lVar12 + 1;
    } while (bVar4);
    pTVar19 = this->_tileBuffer;
  }
  plVar3 = *(long **)((long)&(pTVar19->exception).field_2 + 8);
  if (plVar3 == (long *)0x0) {
    pDVar8 = this->_ofd;
LAB_00206d9f:
    uVar20 = pDVar8->maxSampleCountTableSize;
  }
  else {
    iVar5 = (**(code **)(*plVar3 + 0x20))
                      (plVar3,(pTVar19->exception)._M_dataplus._M_p,iVar14,tileRange.min.y,
                       &(pTVar19->exception)._M_string_length);
    pTVar19 = this->_tileBuffer;
    *(long *)&(pTVar19->exception).field_2 = (long)iVar5;
    pDVar8 = this->_ofd;
    if (*(long *)((long)&(pTVar19->exception).field_2 + 8) == 0) goto LAB_00206d9f;
    uVar20 = pDVar8->maxSampleCountTableSize;
    if ((pTVar19->exception).field_2._M_allocated_capacity < uVar20) goto LAB_00206db2;
  }
  (pTVar19->exception).field_2._M_allocated_capacity = uVar20;
  (pTVar19->exception)._M_string_length = (size_type)(pTVar19->exception)._M_dataplus._M_p;
LAB_00206db2:
  plVar3 = *(long **)&pTVar19->dy;
  pTVar19->compressor = (Compressor *)(writePtr + -(long)pTVar19->buffer);
  *(Compressor **)&pTVar19->format = (Compressor *)(writePtr + -(long)pTVar19->buffer);
  *(char **)&pTVar19->dataSize = pTVar19->buffer;
  if (plVar3 != (long *)0x0) {
    (**(code **)(*plVar3 + 8))(plVar3);
    pDVar8 = this->_ofd;
  }
  pCVar9 = Header::compression(&pDVar8->header);
  pCVar10 = newTileCompressor(*pCVar9,uVar23,(ulong)(this->_ofd->tileDesc).ySize,&this->_ofd->header
                             );
  pTVar1 = this->_tileBuffer;
  *(Compressor **)&pTVar1->dy = pCVar10;
  if (pCVar10 != (Compressor *)0x0) {
    local_48 = tileRange.min.x;
    iStack_44 = tileRange.min.y;
    iStack_40 = tileRange.max.x;
    iStack_3c = tileRange.max.y;
    iVar5 = (*pCVar10->_vptr_Compressor[5])
                      (pCVar10,*(undefined8 *)&pTVar1->dataSize,(ulong)*(uint *)&pTVar1->compressor,
                       &local_48,&compPtr);
    pTVar1 = this->_tileBuffer;
    if ((Compressor *)(long)iVar5 < pTVar1->compressor) {
      pTVar1->compressor = (Compressor *)(long)iVar5;
      *(char **)&pTVar1->dataSize = compPtr;
    }
    else {
      pDVar8 = this->_ofd;
      if ((pDVar8->format == NATIVE) &&
         (writePtr_1 = pTVar1->buffer, readPtr = writePtr_1, -1 < local_bc)) {
        uVar6 = local_bc + 1;
        ppTVar11 = (pDVar8->slices).
                   super__Vector_base<Imf_2_5::(anonymous_namespace)::TOutSliceInfo_*,_std::allocator<Imf_2_5::(anonymous_namespace)::TOutSliceInfo_*>_>
                   ._M_impl.super__Vector_impl_data._M_start;
        ppTVar13 = (pDVar8->slices).
                   super__Vector_base<Imf_2_5::(anonymous_namespace)::TOutSliceInfo_*,_std::allocator<Imf_2_5::(anonymous_namespace)::TOutSliceInfo_*>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
        uVar23 = 0;
        do {
          if (ppTVar13 != ppTVar11) {
            uVar20 = 0;
            uVar16 = 1;
            do {
              convertInPlace(&writePtr_1,&readPtr,ppTVar11[uVar20]->type,
                             bytesPerLine.
                             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                             _M_impl.super__Vector_impl_data._M_start[uVar23]);
              ppTVar11 = (pDVar8->slices).
                         super__Vector_base<Imf_2_5::(anonymous_namespace)::TOutSliceInfo_*,_std::allocator<Imf_2_5::(anonymous_namespace)::TOutSliceInfo_*>_>
                         ._M_impl.super__Vector_impl_data._M_start;
              ppTVar13 = (pDVar8->slices).
                         super__Vector_base<Imf_2_5::(anonymous_namespace)::TOutSliceInfo_*,_std::allocator<Imf_2_5::(anonymous_namespace)::TOutSliceInfo_*>_>
                         ._M_impl.super__Vector_impl_data._M_finish;
              bVar4 = uVar16 < (ulong)((long)ppTVar13 - (long)ppTVar11 >> 3);
              uVar20 = uVar16;
              uVar16 = (ulong)((int)uVar16 + 1);
            } while (bVar4);
          }
          uVar23 = uVar23 + 1;
        } while (uVar23 != uVar6);
      }
    }
  }
  if (yOffsets.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(yOffsets.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)yOffsets.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)yOffsets.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (xOffsets.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(xOffsets.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)xOffsets.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)xOffsets.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (bytesPerLine.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(bytesPerLine.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)bytesPerLine.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)bytesPerLine.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void
TileBufferTask::execute ()
{
    try
    {
        //
        // Calculate information about the tile
        //

        Box2i tileRange = OPENEXR_IMF_INTERNAL_NAMESPACE::dataWindowForTile (
                _ifd->tileDesc,
                _ifd->minX, _ifd->maxX,
                _ifd->minY, _ifd->maxY,
                _tileBuffer->dx,
                _tileBuffer->dy,
                _tileBuffer->lx,
                _tileBuffer->ly);

        //
        // Get the size of the tile.
        //

        Array<unsigned int> numPixelsPerScanLine;
        numPixelsPerScanLine.resizeErase(tileRange.max.y - tileRange.min.y + 1);

        int sizeOfTile = 0;
        int maxBytesPerTileLine = 0;

        for (int y = tileRange.min.y; y <= tileRange.max.y; y++)
        {
            numPixelsPerScanLine[y - tileRange.min.y] = 0;

            int bytesPerLine = 0;

            for (int x = tileRange.min.x; x <= tileRange.max.x; x++)
            {
                int xOffset = _ifd->sampleCountXTileCoords * tileRange.min.x;
                int yOffset = _ifd->sampleCountYTileCoords * tileRange.min.y;

                int count = _ifd->getSampleCount(x - xOffset, y - yOffset);
                for (unsigned int c = 0; c < _ifd->slices.size(); ++c)
                {
                    // This slice does not exist in the file.
                    if ( !_ifd->slices[c]->fill)
                    {
                          sizeOfTile += count * pixelTypeSize(_ifd->slices[c]->typeInFile);
                          bytesPerLine += count * pixelTypeSize(_ifd->slices[c]->typeInFile);     
                    }
                }
                numPixelsPerScanLine[y - tileRange.min.y] += count;
            }

            if (bytesPerLine > maxBytesPerTileLine)
                maxBytesPerTileLine = bytesPerLine;
        }

        // (TODO) don't do this every time.
        if (_tileBuffer->compressor != 0)
            delete _tileBuffer->compressor;
        _tileBuffer->compressor = newTileCompressor
                                  (_ifd->header.compression(),
                                   maxBytesPerTileLine,
                                   _ifd->tileDesc.ySize,
                                   _ifd->header);

        //
        // Uncompress the data, if necessary
        //

        if (_tileBuffer->compressor && _tileBuffer->dataSize < static_cast<Int64>(sizeOfTile))
        {
            _tileBuffer->format = _tileBuffer->compressor->format();

            _tileBuffer->dataSize = _tileBuffer->compressor->uncompressTile
                (_tileBuffer->buffer, _tileBuffer->dataSize,
                 tileRange, _tileBuffer->uncompressedData);
        }
        else
        {
            //
            // If the line is uncompressed, it's in XDR format,
            // regardless of the compressor's output format.
            //

            _tileBuffer->format = Compressor::XDR;
            _tileBuffer->uncompressedData = _tileBuffer->buffer;
        }

	//
	// sanity check data size: the uncompressed data should be exactly 
	// 'sizeOfTile' (if it's less, the file is corrupt and there'll be a buffer overrun)
	//
        if (_tileBuffer->dataSize != static_cast<Int64>(sizeOfTile))
	{
		THROW (IEX_NAMESPACE::InputExc, "size mismatch when reading deep tile: expected " << sizeOfTile << "bytes of uncompressed data but got " << _tileBuffer->dataSize);
	}

        //
        // Convert the tile of pixel data back from the machine-independent
        // representation, and store the result in the frame buffer.
        //

        const char *readPtr = _tileBuffer->uncompressedData;
                                                        // points to where we
                                                        // read from in the
                                                        // tile block

        //
        // Iterate over the scan lines in the tile.
        //

        for (int y = tileRange.min.y; y <= tileRange.max.y; ++y)
        {
            //
            // Iterate over all image channels.
            //

            for (unsigned int i = 0; i < _ifd->slices.size(); ++i)
            {
                TInSliceInfo &slice = *_ifd->slices[i];

                //
                // These offsets are used to facilitate both
                // absolute and tile-relative pixel coordinates.
                //

                int xOffsetForData = (slice.xTileCoords == 0) ? 0 : tileRange.min.x;
                int yOffsetForData = (slice.yTileCoords == 0) ? 0 : tileRange.min.y;
                int xOffsetForSampleCount =
                        (_ifd->sampleCountXTileCoords == 0) ? 0 : tileRange.min.x;
                int yOffsetForSampleCount =
                        (_ifd->sampleCountYTileCoords == 0) ? 0 : tileRange.min.y;

                //
                // Fill the frame buffer with pixel data.
                //

                if (slice.skip)
                {
                    //
                    // The file contains data for this channel, but
                    // the frame buffer contains no slice for this channel.
                    //

                    skipChannel (readPtr, slice.typeInFile,
                                 numPixelsPerScanLine[y - tileRange.min.y]);
                }
                else
                {
                    //
                    // The frame buffer contains a slice for this channel.
                    //

                    copyIntoDeepFrameBuffer (readPtr, slice.pointerArrayBase,
                                             _ifd->sampleCountSliceBase,
                                             _ifd->sampleCountXStride,
                                             _ifd->sampleCountYStride,
                                             y,
                                             tileRange.min.x,
                                             tileRange.max.x,
                                             xOffsetForSampleCount, yOffsetForSampleCount,
                                             xOffsetForData, yOffsetForData,
                                             slice.sampleStride, 
                                             slice.xStride,
                                             slice.yStride,
                                             slice.fill,
                                             slice.fillValue, _tileBuffer->format,
                                             slice.typeInFrameBuffer,
                                             slice.typeInFile);
                }
            }
        }
    }
    catch (std::exception &e)
    {
        if (!_tileBuffer->hasException)
        {
            _tileBuffer->exception = e.what ();
            _tileBuffer->hasException = true;
        }
    }
    catch (...)
    {
        if (!_tileBuffer->hasException)
        {
            _tileBuffer->exception = "unrecognized exception";
            _tileBuffer->hasException = true;
        }
    }
}